

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_44(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  undefined1 local_6c [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  LNodeRStmt local_58;
  shared_ptr<LNode> vars;
  shared_ptr<LNodeData<LNodeRStmt>_> r;
  
  get_node((LParser *)&vars,in_ESI);
  local_6c._0_4_ = 0x34;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)(local_6c + 4),
             (__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)&vars);
  LNodeRStmt::LNodeRStmt(&local_58,(shared_ptr<LNode> *)(local_6c + 4));
  std::make_shared<LNodeData<LNodeRStmt>,LNodeType,LNodeRStmt>
            ((LNodeType *)&r,(LNodeRStmt *)local_6c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  _Var1 = r.super___shared_ptr<LNodeData<LNodeRStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  r.super___shared_ptr<LNodeData<LNodeRStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (LLexer *)r.super___shared_ptr<LNodeData<LNodeRStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  r.super___shared_ptr<LNodeData<LNodeRStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<LNodeData<LNodeRStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_44() {
    // RStmt : RETURN Vars BR Brs
    auto vars = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeRStmt>>(LNodeType::RStmt, LNodeRStmt(vars));
    return r;
}